

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

DdNode * cuddUniqueInter(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  DdSubtable *pDVar4;
  bool bVar5;
  DdNode *local_70;
  DdNode *looking2;
  int gcNumber;
  DdSubtable *subtable;
  DdNodePtr *previousP;
  DdNode *looking;
  DdNodePtr *nodelist;
  int retval;
  uint level;
  int pos;
  DdNode *E_local;
  DdNode *T_local;
  int index_local;
  DdManager *unique_local;
  
  if ((index < unique->size) || (iVar3 = ddResizeTable(unique,index), iVar3 != 0)) {
    pDVar4 = unique->subtables + (uint)unique->perm[index];
    uVar1 = (uint)T;
    uVar2 = (uint)E;
    subtable = (DdSubtable *)
               (pDVar4->nodelist +
               (int)((((uint)(*(long *)(((ulong)T & 0xfffffffffffffffe) + 0x20) << 1) | uVar1 & 1) *
                      0xc00005 +
                     ((uint)(*(long *)(((ulong)E & 0xfffffffffffffffe) + 0x20) << 1) | uVar2 & 1)) *
                     0x40f1f9 >> ((byte)pDVar4->shift & 0x1f)));
    previousP = subtable->nodelist;
    while (T < previousP[2]) {
      subtable = (DdSubtable *)(previousP + 1);
      previousP = subtable->nodelist;
    }
    while( true ) {
      bVar5 = false;
      if (T == previousP[2]) {
        bVar5 = E < previousP[3];
      }
      if (!bVar5) break;
      subtable = (DdSubtable *)(previousP + 1);
      previousP = subtable->nodelist;
    }
    if ((T == previousP[2]) && (E == previousP[3])) {
      if (*(int *)((long)previousP + 4) == 0) {
        cuddReclaim(unique,(DdNode *)previousP);
      }
      unique_local = (DdManager *)previousP;
    }
    else if ((unique->autoDyn == 0) ||
            (unique->keys - (unique->dead & unique->countDead) < unique->nextDyn)) {
      if (pDVar4->maxKeys < pDVar4->keys) {
        if ((unique->gcEnabled == 0) ||
           ((unique->dead <= unique->minDead &&
            ((unique->dead <= unique->minDead >> 1 ||
             ((double)pDVar4->dead <= (double)pDVar4->keys * 0.95)))))) {
          cuddRehash(unique,unique->perm[index]);
        }
        else {
          cuddGarbageCollect(unique,1);
        }
        subtable = (DdSubtable *)
                   (pDVar4->nodelist +
                   (int)((((uint)(*(long *)(((ulong)T & 0xfffffffffffffffe) + 0x20) << 1) |
                          uVar1 & 1) * 0xc00005 +
                         ((uint)(*(long *)(((ulong)E & 0xfffffffffffffffe) + 0x20) << 1) | uVar2 & 1
                         )) * 0x40f1f9 >> ((byte)pDVar4->shift & 0x1f)));
        previousP = subtable->nodelist;
        while (T < previousP[2]) {
          subtable = (DdSubtable *)(previousP + 1);
          previousP = subtable->nodelist;
        }
        while( true ) {
          bVar5 = false;
          if (T == previousP[2]) {
            bVar5 = E < previousP[3];
          }
          if (!bVar5) break;
          subtable = (DdSubtable *)(previousP + 1);
          previousP = subtable->nodelist;
        }
      }
      iVar3 = unique->garbageCollections;
      unique_local = (DdManager *)cuddAllocNode(unique);
      if (unique_local == (DdManager *)0x0) {
        unique_local = (DdManager *)0x0;
      }
      else {
        unique->keys = unique->keys + 1;
        pDVar4->keys = pDVar4->keys + 1;
        if (iVar3 != unique->garbageCollections) {
          subtable = (DdSubtable *)
                     (pDVar4->nodelist +
                     (int)((((uint)(*(long *)(((ulong)T & 0xfffffffffffffffe) + 0x20) << 1) |
                            uVar1 & 1) * 0xc00005 +
                           ((uint)(*(long *)(((ulong)E & 0xfffffffffffffffe) + 0x20) << 1) |
                           uVar2 & 1)) * 0x40f1f9 >> ((byte)pDVar4->shift & 0x1f)));
          local_70 = (DdNode *)subtable->nodelist;
          while (T < (local_70->type).kids.T) {
            subtable = (DdSubtable *)&local_70->next;
            local_70 = *(DdNode **)subtable;
          }
          while( true ) {
            bVar5 = false;
            if (T == (local_70->type).kids.T) {
              bVar5 = E < (local_70->type).kids.E;
            }
            if (!bVar5) break;
            subtable = (DdSubtable *)&local_70->next;
            local_70 = *(DdNode **)subtable;
          }
        }
        (unique_local->sentinel).index = index;
        (unique_local->sentinel).type.kids.T = T;
        (unique_local->sentinel).type.kids.E = E;
        (unique_local->sentinel).next = (DdNode *)subtable->nodelist;
        subtable->nodelist = (DdNode **)unique_local;
        T->ref = T->ref + 1;
        *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
      }
    }
    else {
      iVar3 = Cudd_ReduceHeap(unique,unique->autoMethod,10);
      if (iVar3 == 0) {
        unique->reordered = 2;
      }
      unique_local = (DdManager *)0x0;
    }
  }
  else {
    unique_local = (DdManager *)0x0;
  }
  return &unique_local->sentinel;
}

Assistant:

DdNode *
cuddUniqueInter(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    int pos;
    unsigned int level;
    int retval;
    DdNodePtr *nodelist;
    DdNode *looking;
    DdNodePtr *previousP;
    DdSubtable *subtable;
    int gcNumber;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (index >= unique->size) {
        if (!ddResizeTable(unique,index)) return(NULL);
    }

    level = unique->perm[index];
    subtable = &(unique->subtables[level]);

#ifdef DD_DEBUG
    assert(level < (unsigned) cuddI(unique,T->index));
    assert(level < (unsigned) cuddI(unique,Cudd_Regular(E)->index));
#endif

    pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
    nodelist = subtable->nodelist;
    previousP = &(nodelist[pos]);
    looking = *previousP;

    while (T < cuddT(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    while (T == cuddT(looking) && E < cuddE(looking)) {
        previousP = &(looking->next);
        looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }
    if (T == cuddT(looking) && E == cuddE(looking)) {
        if (looking->ref == 0) {
            cuddReclaim(unique,looking);
        }
        return(looking);
    }

    /* countDead is 0 if deads should be counted and ~0 if they should not. */
    if (unique->autoDyn &&
    unique->keys - (unique->dead & unique->countDead) >= unique->nextDyn) {
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) return(NULL);
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) return(NULL);
#endif
        retval = Cudd_ReduceHeap(unique,unique->autoMethod,10); /* 10 = whatever */
        if (retval == 0) unique->reordered = 2;
#ifdef DD_DEBUG
        retval = Cudd_DebugCheck(unique);
        if (retval != 0) unique->reordered = 2;
        retval = Cudd_CheckKeys(unique);
        if (retval != 0) unique->reordered = 2;
#endif
        return(NULL);
    }

    if (subtable->keys > subtable->maxKeys) {
        if (unique->gcEnabled &&
            ((unique->dead > unique->minDead) ||
            ((unique->dead > unique->minDead / 2) &&
            (subtable->dead > subtable->keys * 0.95)))) { /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            cuddRehash(unique,(int)level);
        }
        /* Update pointer to insertion point. In the case of rehashing,
        ** the slot may have changed. In the case of garbage collection,
        ** the predecessor may have been dead. */
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking = *previousP;

        while (T < cuddT(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking) && E < cuddE(looking)) {
            previousP = &(looking->next);
            looking = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }

    gcNumber = unique->garbageCollections;
    looking = cuddAllocNode(unique);
    if (looking == NULL) {
        return(NULL);
    }
    unique->keys++;
    subtable->keys++;

    if (gcNumber != unique->garbageCollections) {
        DdNode *looking2;
        pos = ddHash(cuddF2L(T), cuddF2L(E), subtable->shift);
        nodelist = subtable->nodelist;
        previousP = &(nodelist[pos]);
        looking2 = *previousP;

        while (T < cuddT(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
        while (T == cuddT(looking2) && E < cuddE(looking2)) {
            previousP = &(looking2->next);
            looking2 = *previousP;
#ifdef DD_UNIQUE_PROFILE
            unique->uniqueLinks++;
#endif
        }
    }
    looking->index = index;
    cuddT(looking) = T;
    cuddE(looking) = E;
    looking->next = *previousP;
    *previousP = looking;
    cuddSatInc(T->ref);         /* we know T is a regular pointer */
    cuddRef(E);

#ifdef DD_DEBUG
    cuddCheckCollisionOrdering(unique,level,pos);
#endif

//    assert( Cudd_Regular(T)->Id < 100000000 );
//    assert( Cudd_Regular(E)->Id < 100000000 );
    return(looking);

}